

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O1

Clause * __thiscall
Saturation::ManCSPassiveClauseContainer::popSelected(ManCSPassiveClauseContainer *this)

{
  pointer *pppCVar1;
  int iVar2;
  pointer ppCVar3;
  Clause *pCVar4;
  char *__nptr;
  uint uVar5;
  int *piVar6;
  long lVar7;
  ostream *poVar8;
  pointer ppCVar9;
  HandlerList *pHVar10;
  pointer ppCVar11;
  string id;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pick a clause:\n",0xf)
    ;
    local_50 = 0;
    local_48 = '\0';
    local_58 = &local_48;
    std::operator>>((istream *)&std::cin,(string *)&local_58);
    __nptr = local_58;
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(__nptr,&local_38,10);
    if (local_38 == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_00688293:
      std::__throw_out_of_range("stoi");
    }
    uVar5 = (uint)lVar7;
    if (((int)uVar5 != lVar7) || (*piVar6 == 0x22)) goto LAB_00688293;
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    ppCVar11 = (this->clauses).
               super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppCVar3 = (this->clauses).
              super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar7 = (long)ppCVar3 - (long)ppCVar11 >> 5;
    ppCVar9 = ppCVar11;
    if (0 < lVar7) {
      ppCVar9 = (pointer)(((long)ppCVar3 - (long)ppCVar11 & 0xffffffffffffffe0U) + (long)ppCVar11);
      lVar7 = lVar7 + 1;
      ppCVar11 = ppCVar11 + 2;
      do {
        if ((ppCVar11[-2]->super_Unit)._number == uVar5) {
          ppCVar11 = ppCVar11 + -2;
          goto LAB_006881dd;
        }
        if ((ppCVar11[-1]->super_Unit)._number == uVar5) {
          ppCVar11 = ppCVar11 + -1;
          goto LAB_006881dd;
        }
        if (((*ppCVar11)->super_Unit)._number == uVar5) goto LAB_006881dd;
        if ((ppCVar11[1]->super_Unit)._number == uVar5) {
          ppCVar11 = ppCVar11 + 1;
          goto LAB_006881dd;
        }
        lVar7 = lVar7 + -1;
        ppCVar11 = ppCVar11 + 4;
      } while (1 < lVar7);
    }
    lVar7 = (long)ppCVar3 - (long)ppCVar9 >> 3;
    if (lVar7 == 1) {
LAB_006881bf:
      ppCVar11 = ppCVar9;
      if (((*ppCVar9)->super_Unit)._number != uVar5) {
        ppCVar11 = ppCVar3;
      }
    }
    else if (lVar7 == 2) {
LAB_006881b4:
      ppCVar11 = ppCVar9;
      if (((*ppCVar9)->super_Unit)._number != uVar5) {
        ppCVar9 = ppCVar9 + 1;
        goto LAB_006881bf;
      }
    }
    else {
      ppCVar11 = ppCVar3;
      if ((lVar7 == 3) && (ppCVar11 = ppCVar9, ((*ppCVar9)->super_Unit)._number != uVar5)) {
        ppCVar9 = ppCVar9 + 1;
        goto LAB_006881b4;
      }
    }
LAB_006881dd:
    if (ppCVar11 == ppCVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"User error: No clause in Passive has id ",0x28);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!\n",2);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    if (ppCVar11 != ppCVar3) {
      pCVar4 = *ppCVar11;
      ppCVar3 = ppCVar11 + 1;
      ppCVar9 = (this->clauses).
                super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 != ppCVar9) {
        memmove(ppCVar11,ppCVar3,(long)ppCVar9 - (long)ppCVar3);
      }
      pppCVar1 = &(this->clauses).
                  super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + -1;
      for (pHVar10 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                     super_ClauseContainer.selectedEvent.super_BaseEvent._handlers;
          pHVar10 != (HandlerList *)0x0; pHVar10 = pHVar10->_tail) {
        (*pHVar10->_head->_vptr_HandlerStruct[2])(pHVar10->_head,pCVar4);
      }
      return pCVar4;
    }
  } while( true );
}

Assistant:

Clause* ManCSPassiveClauseContainer::popSelected()
{
  ASS(!clauses.empty());

  std::vector<Clause*>::iterator selectedClauseIt;
  while(true)
  {
    // ask user to pick a clause id
    std::cout << "Pick a clause:\n";
    std::string id;
    std::cin >> id;
    unsigned selectedId = std::stoi(id);

    // search clause with that id
    selectedClauseIt = std::find_if(clauses.begin(), clauses.end(), 
      [&](Clause* c) -> bool { return c->number() == selectedId; });
    if(selectedClauseIt != clauses.end())
    {
      break;
    }
    else
    {
      std::cout << "User error: No clause in Passive has id " << id << "!\n";
    }
  }

  auto selectedClause	= *selectedClauseIt;
  clauses.erase(selectedClauseIt);
  selectedEvent.fire(selectedClause);

  return selectedClause;
}